

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall Potassco::ProgramOptions::ValueError::~ValueError(ValueError *this)

{
  ~ValueError(this);
  operator_delete(this);
  return;
}

Assistant:

~ValueError() throw () {}